

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O1

char * litString(char *str)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (str == (char *)0x0) {
    return "NULL";
  }
  sVar3 = strlen(str);
  pcVar4 = (char *)get_ioblob(sVar3 * 2 + 2);
  *pcVar4 = '\"';
  pcVar5 = pcVar4 + 1;
  do {
    cVar1 = *str;
    if (cVar1 == '\"') {
      pcVar5[0] = '\\';
      pcVar5[1] = '\"';
      pcVar5 = pcVar5 + 2;
LAB_0010cd76:
      bVar2 = true;
    }
    else {
      if (cVar1 != '\0') {
        *pcVar5 = cVar1;
        pcVar5 = pcVar5 + 1;
        goto LAB_0010cd76;
      }
      pcVar5[0] = '\"';
      pcVar5[1] = '\0';
      pcVar5 = pcVar5 + 2;
      bVar2 = false;
    }
    str = str + 1;
    if (!bVar2) {
      return pcVar4;
    }
  } while( true );
}

Assistant:

const char *litString(const char *str)
{
    if (str) {
        const size_t slen = (strlen(str) + 1) * 2;
        char *retval = (char *) get_ioblob(slen);
        char *ptr = retval;
        *(ptr++) = '"';
        while (1) {
            const char ch = *(str++);
            if (ch == '\0') {
                *(ptr++) = '"';
                *(ptr++) = '\0';
                break;
            } else if (ch == '"') {
                *(ptr++) = '\\';
                *(ptr++) = '"';
            } else {
                *(ptr++) = ch;
            }
        }
        return retval;
    }
    return "NULL";
}